

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void __thiscall google::protobuf::DynamicMessage::SharedCtor(DynamicMessage *this,bool lock_factory)

{
  FieldDescriptor *field;
  uint uVar1;
  TypeInfo *pTVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  once_flag *poVar6;
  DynamicMessageFactory *pDVar7;
  uint uVar8;
  bool bVar9;
  int iVar10;
  undefined4 uVar11;
  Descriptor *pDVar12;
  undefined4 extraout_var;
  EnumValueDescriptor *pEVar13;
  _func_int **pp_Var14;
  Message *default_entry;
  ThreadSafeArena *pTVar15;
  long *plVar16;
  long lVar17;
  DynamicMapField *this_00;
  undefined7 in_register_00000031;
  Arena *pAVar18;
  ThreadSafeArena *this_01;
  undefined8 *puVar19;
  FieldDescriptor *local_58;
  _func_void_FieldDescriptor_ptr *local_50;
  undefined4 local_44;
  Descriptor *local_40;
  long local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000031,lock_factory);
  pTVar2 = this->type_info_;
  pDVar12 = pTVar2->type;
  if (0 < *(int *)(pDVar12 + 0x68)) {
    plVar16 = (long *)(*(long *)(pDVar12 + 0x30) + 0x20);
    lVar17 = 0;
    iVar10 = 0;
    do {
      if ((*(int *)((long)plVar16 + -0x1c) != 1) || ((*(byte *)(*plVar16 + 1) & 2) == 0)) {
        *(undefined4 *)
         ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
         (long)(iVar10 * 4 + pTVar2->oneof_case_offset)) = 0;
        iVar10 = iVar10 + 1;
      }
      lVar17 = lVar17 + 1;
      plVar16 = plVar16 + 5;
    } while (lVar17 < *(int *)(pDVar12 + 0x68));
  }
  if ((long)pTVar2->extensions_offset != -1) {
    uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    internal::ExtensionSet::ExtensionSet
              ((ExtensionSet *)
               ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
               (long)pTVar2->extensions_offset),pAVar18);
  }
  if (0 < *(int *)(pDVar12 + 4)) {
    lVar17 = 0;
    local_38 = 0;
    local_40 = pDVar12;
    do {
      lVar4 = *(long *)(local_40 + 0x28);
      uVar1 = (this->type_info_->offsets)._M_t.
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[local_38];
      lVar5 = *(long *)(this->type_info_->type + 0x28);
      poVar6 = *(once_flag **)(lVar5 + 0x18 + lVar17);
      if (poVar6 != (once_flag *)0x0) {
        local_58 = (FieldDescriptor *)(lVar5 + lVar17);
        local_50 = FieldDescriptor::TypeOnceInit;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (poVar6,&local_50,&local_58);
      }
      uVar8 = uVar1 & 0xfffffffe;
      if (*(char *)(lVar5 + 2 + lVar17) != '\v') {
        uVar8 = uVar1;
      }
      if ((((*(byte *)(lVar4 + 1 + lVar17) & 0x10) == 0) ||
          (lVar5 = *(long *)(lVar4 + 0x28 + lVar17), lVar5 == 0)) ||
         ((*(int *)(lVar5 + 4) == 1 && ((*(byte *)(*(long *)(lVar5 + 0x20) + 1) & 2) != 0)))) {
        field = (FieldDescriptor *)(lVar4 + lVar17);
        poVar6 = *(once_flag **)(lVar4 + 0x18 + lVar17);
        if (poVar6 != (once_flag *)0x0) {
          local_50 = FieldDescriptor::TypeOnceInit;
          local_58 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (poVar6,&local_50,&local_58);
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)(lVar4 + 2 + lVar17) * 4)
            - 1U < 10) {
          this_00 = (DynamicMapField *)
                    ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                    (long)(int)uVar8);
          switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                         (ulong)*(byte *)(lVar4 + 2 + lVar17) * 4)) {
          default:
            if ((~*(byte *)(lVar4 + 1 + lVar17) & 0x60) == 0) goto LAB_003913bc;
            uVar11 = *(undefined4 *)(lVar4 + 0x40 + lVar17);
LAB_00391393:
            *(undefined4 *)
             &(this_00->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase._vptr_MapFieldBase = uVar11;
            break;
          case 2:
          case 4:
            if ((~*(byte *)(lVar4 + 1 + lVar17) & 0x60) == 0) goto LAB_003913bc;
            pp_Var14 = *(_func_int ***)(lVar4 + 0x40 + lVar17);
LAB_003912f5:
            (this_00->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase = pp_Var14;
            break;
          case 5:
            if ((~*(byte *)(lVar4 + 1 + lVar17) & 0x60) == 0) goto LAB_003913bc;
            (this_00->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase = *(_func_int ***)(lVar4 + 0x40 + lVar17);
            break;
          case 6:
            if ((~*(byte *)(lVar4 + 1 + lVar17) & 0x60) == 0) goto LAB_003913bc;
            *(undefined4 *)
             &(this_00->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase._vptr_MapFieldBase = *(undefined4 *)(lVar4 + 0x40 + lVar17);
            break;
          case 7:
            if ((~*(byte *)(lVar4 + 1 + lVar17) & 0x60) == 0) goto LAB_003913bc;
            *(undefined1 *)
             &(this_00->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase._vptr_MapFieldBase = *(undefined1 *)(lVar4 + 0x40 + lVar17);
            break;
          case 8:
            if ((~*(byte *)(lVar4 + 1 + lVar17) & 0x60) != 0) {
              pEVar13 = FieldDescriptor::default_value_enum(field);
              uVar11 = *(undefined4 *)(pEVar13 + 4);
              goto LAB_00391393;
            }
LAB_003913bc:
            uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
            pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
            if ((uVar3 & 1) != 0) {
              pAVar18 = *(Arena **)pAVar18;
            }
            (this_00->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase = (_func_int **)0x0;
            (this_00->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase.arena_ = pAVar18;
            break;
          case 9:
            if ((~*(byte *)(lVar4 + 1 + lVar17) & 0x60) != 0) {
              if (*(long *)(*(long *)(lVar4 + 0x40 + lVar17) + 8) == 0) {
                pp_Var14 = (_func_int **)&internal::fixed_address_empty_string_abi_cxx11_;
              }
              else {
                pp_Var14 = (_func_int **)0x0;
              }
              goto LAB_003912f5;
            }
LAB_0039140a:
            uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
            pp_Var14 = (_func_int **)(uVar3 & 0xfffffffffffffffc);
            if ((uVar3 & 1) != 0) {
              pp_Var14 = (_func_int **)*pp_Var14;
            }
            (this_00->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase = pp_Var14;
            (this_00->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase.arena_ = (Arena *)0x0;
            (this_00->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase.repeated_field_ = (RepeatedPtrField<google::protobuf::Message> *)0x0;
            break;
          case 10:
            if ((~*(byte *)(lVar4 + 1 + lVar17) & 0x60) == 0) {
              bVar9 = anon_unknown_0::IsMapFieldInApi(field);
              if (!bVar9) goto LAB_0039140a;
              if ((char)local_44 == '\0') {
                uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
                puVar19 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
                if ((uVar3 & 1) != 0) {
                  puVar19 = (undefined8 *)*puVar19;
                }
                pDVar7 = this->type_info_->factory;
                pDVar12 = FieldDescriptor::message_type(field);
                default_entry = DynamicMessageFactory::GetPrototypeNoLock(pDVar7,pDVar12);
              }
              else {
                uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
                puVar19 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
                if ((uVar3 & 1) != 0) {
                  puVar19 = (undefined8 *)*puVar19;
                }
                pDVar7 = this->type_info_->factory;
                pDVar12 = FieldDescriptor::message_type(field);
                iVar10 = (*(pDVar7->super_MessageFactory)._vptr_MessageFactory[2])(pDVar7,pDVar12);
                default_entry = (Message *)CONCAT44(extraout_var,iVar10);
              }
              if (puVar19 == (undefined8 *)0x0) {
                internal::DynamicMapField::DynamicMapField(this_00,default_entry);
              }
              else {
                uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
                pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
                if ((uVar3 & 1) != 0) {
                  pAVar18 = *(Arena **)pAVar18;
                }
                internal::DynamicMapField::DynamicMapField(this_00,default_entry,pAVar18);
                this_01 = (ThreadSafeArena *)
                          (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
                if (((ulong)this_01 & 2) == 0) {
                  pTVar15 = this_01;
                  if (((ulong)this_01 & 1) != 0) {
                    pTVar15 = *(ThreadSafeArena **)((ulong)this_01 & 0xfffffffffffffffc);
                  }
                }
                else {
                  pTVar15 = (ThreadSafeArena *)0x0;
                }
                if (pTVar15 != (ThreadSafeArena *)0x0) {
                  if (((ulong)this_01 & 1) != 0) {
                    this_01 = *(ThreadSafeArena **)((ulong)this_01 & 0xfffffffffffffffc);
                  }
                  internal::ThreadSafeArena::AddCleanup
                            (this_01,this_00,
                             internal::
                             arena_destruct_object<google::protobuf::internal::DynamicMapField>);
                }
              }
            }
            else {
              (this_00->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase._vptr_MapFieldBase = (_func_int **)0x0;
            }
          }
        }
      }
      local_38 = local_38 + 1;
      lVar17 = lVar17 + 0x48;
    } while (local_38 < *(int *)(local_40 + 4));
  }
  return;
}

Assistant:

void DynamicMessage::SharedCtor(bool lock_factory) {
  // We need to call constructors for various fields manually and set
  // default values where appropriate.  We use placement new to call
  // constructors.  If you haven't heard of placement new, I suggest Googling
  // it now.  We use placement new even for primitive types that don't have
  // constructors for consistency.  (In theory, placement new should be used
  // any time you are trying to convert untyped memory to typed memory, though
  // in practice that's not strictly necessary for types that don't have a
  // constructor.)

  const Descriptor* descriptor = type_info_->type;
  // Initialize oneof cases.
  int oneof_count = 0;
  for (int i = 0; i < descriptor->oneof_decl_count(); ++i) {
    if (descriptor->oneof_decl(i)->is_synthetic()) continue;
    new (MutableOneofCaseRaw(oneof_count++)) uint32_t{0};
  }

  if (type_info_->extensions_offset != -1) {
    new (MutableExtensionsRaw()) ExtensionSet(GetArenaForAllocation());
  }
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = MutableRaw(i);
    if (InRealOneof(field)) {
      continue;
    }
    switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                                  \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                          \
    if (!field->is_repeated()) {                                    \
      new (field_ptr) TYPE(field->default_value_##TYPE());          \
    } else {                                                        \
      new (field_ptr) RepeatedField<TYPE>(GetArenaForAllocation()); \
    }                                                               \
    break;

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_ENUM:
        if (!field->is_repeated()) {
          new (field_ptr) int{field->default_value_enum()->number()};
        } else {
          new (field_ptr) RepeatedField<int>(GetArenaForAllocation());
        }
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            if (!field->is_repeated()) {
              const std::string* default_value =
                  field->default_value_string().empty()
                      ? &internal::GetEmptyStringAlreadyInited()
                      : nullptr;
              ArenaStringPtr* asp = new (field_ptr) ArenaStringPtr();
              asp->UnsafeSetDefault(default_value);
            } else {
              new (field_ptr)
                  RepeatedPtrField<std::string>(GetArenaForAllocation());
            }
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (!field->is_repeated()) {
          new (field_ptr) Message*(nullptr);
        } else {
          if (IsMapFieldInApi(field)) {
            // We need to lock in most cases to avoid data racing. Only not lock
            // when the constructor is called inside GetPrototype(), in which
            // case we have already locked the factory.
            if (lock_factory) {
              if (GetArenaForAllocation() != nullptr) {
                new (field_ptr) DynamicMapField(
                    type_info_->factory->GetPrototype(field->message_type()),
                    GetArenaForAllocation());
                if (GetOwningArena() != nullptr) {
                  // Needs to destroy the mutex member.
                  GetOwningArena()->OwnDestructor(
                      static_cast<DynamicMapField*>(field_ptr));
                }
              } else {
                new (field_ptr) DynamicMapField(
                    type_info_->factory->GetPrototype(field->message_type()));
              }
            } else {
              if (GetArenaForAllocation() != nullptr) {
                new (field_ptr)
                    DynamicMapField(type_info_->factory->GetPrototypeNoLock(
                                        field->message_type()),
                                    GetArenaForAllocation());
                if (GetOwningArena() != nullptr) {
                  // Needs to destroy the mutex member.
                  GetOwningArena()->OwnDestructor(
                      static_cast<DynamicMapField*>(field_ptr));
                }
              } else {
                new (field_ptr)
                    DynamicMapField(type_info_->factory->GetPrototypeNoLock(
                        field->message_type()));
              }
            }
          } else {
            new (field_ptr) RepeatedPtrField<Message>(GetArenaForAllocation());
          }
        }
        break;
      }
    }
  }
}